

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteTopLevelProject
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  cmValue cVar4;
  ostream *poVar5;
  cmValue cVar6;
  size_type sVar7;
  pointer pcVar8;
  cmGlobalGhsMultiGenerator *this_00;
  string_view value;
  string_view value_00;
  string_view value_01;
  string local_40;
  
  this_00 = this;
  WriteFileHeader(this,fout);
  WriteMacros(this_00,fout,root);
  WriteHighLevelDirectives(this,fout,root);
  GhsMultiGpj::WriteGpjTag(PROJECT,fout);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"# Top Level Project File\n",0x19);
  pcVar2 = root->Makefile;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GHS_BSP_NAME","");
  cVar4 = cmMakefile::GetDefinition(pcVar2,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((cVar4.Value != (string *)0x0) &&
     (value._M_str = ((cVar4.Value)->_M_dataplus)._M_p,
     value._M_len = (cVar4.Value)->_M_string_length, bVar3 = cmValue::IsOff(value), !bVar3)) {
    std::__ostream_insert<char,std::char_traits<char>>(fout,"    -bsp ",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,((cVar4.Value)->_M_dataplus)._M_p,(cVar4.Value)->_M_string_length);
    local_40._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_40,1);
  }
  pcVar2 = root->Makefile;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GHS_OS_DIR","");
  cVar4 = cmMakefile::GetDefinition(pcVar2,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value != (string *)0x0) {
    value_00._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
    value_00._M_len = (cVar4.Value)->_M_string_length;
    bVar3 = cmValue::IsOff(value_00);
    if (!bVar3) {
      pcVar2 = root->Makefile;
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GHS_OS_DIR_OPTION","");
      cVar6 = cmMakefile::GetDefinition(pcVar2,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(fout,"    ",4);
      if ((cVar6.Value == (string *)0x0) ||
         (value_01._M_str = ((cVar6.Value)->_M_dataplus)._M_p,
         value_01._M_len = (cVar6.Value)->_M_string_length, bVar3 = cmValue::IsOff(value_01), bVar3)
         ) {
        pcVar8 = "";
        sVar7 = 0;
      }
      else {
        pcVar8 = ((cVar6.Value)->_M_dataplus)._M_p;
        sVar7 = (cVar6.Value)->_M_string_length;
      }
      std::__ostream_insert<char,std::char_traits<char>>(fout,pcVar8,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>(fout,"\"",1);
      poVar5 = operator<<(fout,cVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
      return;
    }
    return;
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTopLevelProject(std::ostream& fout,
                                                     cmLocalGenerator* root)
{
  this->WriteFileHeader(fout);
  this->WriteMacros(fout, root);
  this->WriteHighLevelDirectives(fout, root);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fout);

  fout << "# Top Level Project File\n";

  // Specify BSP option if supplied by user
  // -- not all platforms require this entry in the project file
  cmValue bspName = root->GetMakefile()->GetDefinition("GHS_BSP_NAME");
  if (!cmIsOff(bspName)) {
    fout << "    -bsp " << *bspName << '\n';
  }

  // Specify OS DIR if supplied by user
  // -- not all platforms require this entry in the project file
  cmValue osDir = root->GetMakefile()->GetDefinition("GHS_OS_DIR");
  if (!cmIsOff(osDir)) {
    cmValue osDirOption =
      root->GetMakefile()->GetDefinition("GHS_OS_DIR_OPTION");
    fout << "    ";
    if (cmIsOff(osDirOption)) {
      fout << "";
    } else {
      fout << *osDirOption;
    }
    fout << "\"" << osDir << "\"\n";
  }
}